

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O1

bool __thiscall cmGeneratedFileStreamBase::Close(cmGeneratedFileStreamBase *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  cmGeneratedFileStreamBase *this_00;
  string gzname;
  string resname;
  string local_60;
  string local_40;
  
  pcVar1 = (this->Name)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->Name)._M_string_length);
  if ((this->Compress == true) && (this->CompressExtraExtension == true)) {
    std::__cxx11::string::append((char *)&local_40);
  }
  if (((this->Name)._M_string_length == 0) || (this->Okay != true)) {
LAB_0026c690:
    bVar2 = false;
  }
  else {
    if (this->CopyIfDifferent == true) {
      bVar2 = cmsys::SystemTools::FilesDiffer(&this->TempName,&local_40);
      if (!bVar2) goto LAB_0026c690;
    }
    if (this->Compress == true) {
      pcVar1 = (this->TempName)._M_dataplus._M_p;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar1,pcVar1 + (this->TempName)._M_string_length);
      this_00 = (cmGeneratedFileStreamBase *)&local_60;
      std::__cxx11::string::append((char *)this_00);
      iVar3 = CompressFile(this_00,&this->TempName,&local_60);
      if (iVar3 != 0) {
        cmSystemTools::RenameFile(&local_60,&local_40);
      }
      cmsys::SystemTools::RemoveFile(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      bVar2 = true;
    }
    else {
      bVar2 = true;
      cmSystemTools::RenameFile(&this->TempName,&local_40);
    }
  }
  cmsys::SystemTools::RemoveFile(&this->TempName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmGeneratedFileStreamBase::Close()
{
  bool replaced = false;

  std::string resname = this->Name;
  if (this->Compress && this->CompressExtraExtension) {
    resname += ".gz";
  }

  // Only consider replacing the destination file if no error
  // occurred.
  if (!this->Name.empty() && this->Okay &&
      (!this->CopyIfDifferent ||
       cmSystemTools::FilesDiffer(this->TempName, resname))) {
    // The destination is to be replaced.  Rename the temporary to the
    // destination atomically.
    if (this->Compress) {
      std::string gzname = this->TempName + ".temp.gz";
      if (this->CompressFile(this->TempName, gzname)) {
        this->RenameFile(gzname, resname);
      }
      cmSystemTools::RemoveFile(gzname);
    } else {
      this->RenameFile(this->TempName, resname);
    }

    replaced = true;
  }

  // Else, the destination was not replaced.
  //
  // Always delete the temporary file. We never want it to stay around.
  cmSystemTools::RemoveFile(this->TempName);

  return replaced;
}